

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O2

bool EV_DoFloor(EFloor floortype,line_t_conflict *line,int tag,double speed,double height,int crush,
               int change,bool hexencrush,bool hereticlower)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  FSectorTagIterator it;
  FSectorTagIterator local_38;
  
  FSectorTagIterator::FSectorTagIterator(&local_38,tag,line);
  bVar3 = false;
  while( true ) {
    uVar2 = FSectorTagIterator::Next(&local_38);
    if ((int)uVar2 < 0) break;
    bVar1 = P_CreateFloor(sectors + uVar2,floortype,line,speed,height,crush,change,hexencrush,
                          hereticlower);
    bVar3 = (bool)(bVar3 | bVar1);
  }
  return bVar3;
}

Assistant:

bool EV_DoFloor (DFloor::EFloor floortype, line_t *line, int tag,
				 double speed, double height, int crush, int change, bool hexencrush, bool hereticlower)
{
	int 		secnum;
	bool 		rtn = false;

	// check if a manual trigger; if so do just the sector on the backside
	FSectorTagIterator it(tag, line);
	while ((secnum = it.Next()) >= 0)
	{
		rtn |= P_CreateFloor(&sectors[secnum], floortype, line, speed, height, crush, change, hexencrush, hereticlower);
	}
	return rtn;
}